

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentFunctors.h
# Opt level: O0

void __thiscall
Eigen::internal::swap_assign_op<float>::assignCoeff(swap_assign_op<float> *this,float *a,float *b)

{
  float *b_local;
  float *a_local;
  swap_assign_op<float> *this_local;
  
  std::swap<float>(a,b);
  return;
}

Assistant:

void assignCoeff(Scalar& a, const Scalar& b) const
  {
#ifdef EIGEN_GPUCC
    // FIXME is there some kind of cuda::swap?
    Scalar t=b; const_cast<Scalar&>(b)=a; a=t;
#else
    using std::swap;
    swap(a,const_cast<Scalar&>(b));
#endif
  }